

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_to_lad.cc
# Opt level: O3

int main(int argc,char **argv)

{
  pointer pcVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar8;
  const_iterator cVar9;
  size_t sVar10;
  const_iterator cVar11;
  any *paVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar13;
  long *plVar14;
  int j;
  int i;
  uint uVar15;
  InputGraph graph;
  string pattern_format_name;
  variables_map options_vars;
  positional_options_description positional_options;
  options_description all_options;
  options_description display_options;
  string local_2c8;
  undefined1 local_2a8 [16];
  undefined1 local_298 [24];
  undefined1 local_280 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_250 [32];
  function1<std::vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
  local_230 [32];
  options_description *local_210;
  code *local_208 [2];
  long local_1f8;
  _Rb_tree_node_base local_1f0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c8 [48];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_198 [48];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_168;
  long *local_150;
  long local_140 [2];
  long *local_130 [2];
  long local_120 [3];
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  local_108 [24];
  void *local_f0;
  undefined4 local_e8;
  undefined8 local_e0;
  undefined4 local_d8;
  long local_d0;
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  local_c8 [24];
  long *local_b0 [2];
  long local_a0 [3];
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  local_88 [24];
  void *local_70;
  undefined4 local_68;
  undefined8 local_60;
  undefined4 local_58;
  long local_50;
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  local_48 [24];
  
  local_208[0] = (code *)&local_1f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"Program options","");
  uVar2 = (uint)boost::program_options::options_description::m_default_line_length;
  uVar15 = (uint)boost::program_options::options_description::m_default_line_length >> 1;
  boost::program_options::options_description::options_description
            ((options_description *)local_b0,(string *)local_208,
             (uint)boost::program_options::options_description::m_default_line_length,uVar15);
  if (local_208[0] != (code *)&local_1f8) {
    operator_delete(local_208[0],local_1f8 + 1);
  }
  local_208[0] = (code *)boost::program_options::options_description::add_options();
  pcVar7 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)local_208,"help");
  ptVar8 = boost::program_options::value<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  boost::program_options::options_description_easy_init::operator()
            (pcVar7,(value_semantic *)0x11facb,(char *)ptVar8);
  local_208[0] = (code *)&local_1f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"All options","");
  boost::program_options::options_description::options_description
            ((options_description *)local_130,(string *)local_208,uVar2,uVar15);
  if (local_208[0] != (code *)&local_1f8) {
    operator_delete(local_208[0],local_1f8 + 1);
  }
  local_208[0] = (code *)boost::program_options::options_description::add_options();
  boost::program_options::options_description_easy_init::operator()((char *)local_208,"graph-file");
  boost::program_options::options_description::add((options_description *)local_130);
  boost::program_options::positional_options_description::positional_options_description
            ((positional_options_description *)&local_168);
  boost::program_options::positional_options_description::add((char *)&local_168,0x11f0be);
  boost::program_options::variables_map::variables_map((variables_map *)local_208);
  boost::program_options::basic_command_line_parser<char>::basic_command_line_parser
            ((basic_command_line_parser<char> *)local_280,argc,argv);
  boost::program_options::detail::cmdline::set_options_description((options_description *)local_280)
  ;
  local_210 = (options_description *)local_130;
  boost::program_options::detail::cmdline::set_positional_options
            ((positional_options_description *)local_280);
  boost::program_options::basic_command_line_parser<char>::run
            ((basic_parsed_options<char> *)local_2a8,(basic_command_line_parser<char> *)local_280);
  boost::program_options::store((basic_parsed_options *)local_2a8,(variables_map *)local_208,false);
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector((vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
             *)local_2a8);
  boost::
  function1<std::vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
  ::~function1(local_230);
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1(local_250);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_280);
  boost::program_options::notify((variables_map *)local_208);
  local_280._0_8_ = &local_270;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_280,"help","");
  cVar9 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                  *)&local_1f8,(key_type *)local_280);
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_280._0_8_ !=
      &local_270) {
    operator_delete((void *)local_280._0_8_,(ulong)(local_270._M_dataplus._M_p + 1));
  }
  if (cVar9._M_node == &local_1f0) {
    local_280._0_8_ = &local_270;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_280,"graph-file","");
    cVar11 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
             ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                     *)&local_1f8,(key_type *)local_280);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_280._0_8_ !=
        &local_270) {
      operator_delete((void *)local_280._0_8_,(ulong)(local_270._M_dataplus._M_p + 1));
    }
    if (cVar11._M_node == cVar9._M_node) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Usage: ",7);
      pcVar7 = *argv;
      if (pcVar7 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x12d288);
      }
      else {
        sVar10 = strlen(pcVar7);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar7,sVar10);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout," [options] graph-file",0x15);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
      std::ostream::put(-0x78);
      iVar4 = 1;
      std::ostream::flush();
    }
    else {
      local_2a8._0_8_ = (pointer)local_298;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2a8,"format","");
      cVar11 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                       *)&local_1f8,(key_type *)local_2a8);
      if (cVar11._M_node == cVar9._M_node) {
        local_280._0_8_ = &local_270;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_280,"auto","");
      }
      else {
        local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"format","");
        paVar12 = (any *)boost::program_options::abstract_variables_map::operator[]
                                   ((string *)local_208);
        pbVar13 = boost::any_cast<std::__cxx11::string_const&>(paVar12);
        local_280._0_8_ = &local_270;
        pcVar1 = (pbVar13->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_280,pcVar1,pcVar1 + pbVar13->_M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
          operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
        }
      }
      if ((pointer)local_2a8._0_8_ != (pointer)local_298) {
        operator_delete((void *)local_2a8._0_8_,(ulong)(local_298._0_8_ + 1));
      }
      local_2a8._0_8_ = (pointer)local_298;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2a8,"graph-file","");
      paVar12 = (any *)boost::program_options::abstract_variables_map::operator[]
                                 ((string *)local_208);
      boost::any_cast<std::__cxx11::string_const&>(paVar12);
      read_file_format(&local_2c8,(string *)local_280);
      if ((pointer)local_2a8._0_8_ != (pointer)local_298) {
        operator_delete((void *)local_2a8._0_8_,(ulong)(local_298._0_8_ + 1));
      }
      bVar3 = InputGraph::has_vertex_labels((InputGraph *)&local_2c8);
      if ((bVar3) || (bVar3 = InputGraph::has_edge_labels((InputGraph *)&local_2c8), bVar3)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Error: unsupported graph features",0x21);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '(');
        std::ostream::put('(');
        iVar4 = 1;
        std::ostream::flush();
      }
      else {
        iVar4 = InputGraph::size((InputGraph *)&local_2c8);
        plVar14 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar4);
        std::ios::widen((char)*(undefined8 *)(*plVar14 + -0x18) + (char)plVar14);
        std::ostream::put((char)plVar14);
        std::ostream::flush();
        for (iVar4 = 0; iVar5 = InputGraph::size((InputGraph *)&local_2c8), iVar4 < iVar5;
            iVar4 = iVar4 + 1) {
          iVar5 = InputGraph::degree((InputGraph *)&local_2c8,iVar4);
          std::ostream::operator<<((ostream *)&std::cout,iVar5);
          for (iVar5 = 0; iVar6 = InputGraph::size((InputGraph *)&local_2c8), iVar5 < iVar6;
              iVar5 = iVar5 + 1) {
            bVar3 = InputGraph::adjacent((InputGraph *)&local_2c8,iVar4,iVar5);
            if (bVar3) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
              std::ostream::operator<<((ostream *)&std::cout,iVar5);
            }
          }
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
          std::ostream::put(-0x78);
          std::ostream::flush();
        }
        iVar4 = 0;
      }
      InputGraph::~InputGraph((InputGraph *)&local_2c8);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_280._0_8_ !=
          &local_270) {
        operator_delete((void *)local_280._0_8_,(ulong)(local_270._M_dataplus._M_p + 1));
      }
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Usage: ",7);
    pcVar7 = *argv;
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x12d288);
    }
    else {
      sVar10 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar7,sVar10);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," [options] graph-file",0x15);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
    std::ostream::put(-0x78);
    std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
    std::ostream::put(-0x78);
    std::ostream::flush();
    plVar14 = (long *)boost::program_options::operator<<
                                ((ostream *)&std::cout,(options_description *)local_b0);
    std::ios::widen((char)*(undefined8 *)(*plVar14 + -0x18) + (char)plVar14);
    std::ostream::put((char)plVar14);
    iVar4 = 0;
    std::ostream::flush();
  }
  local_208[0] = __cxa_throw;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(local_198);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(local_1c8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
               *)&local_1f8);
  if (local_150 != local_140) {
    operator_delete(local_150,local_140[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_168);
  std::
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  ::~vector(local_c8);
  if (local_f0 != (void *)0x0) {
    operator_delete(local_f0,local_d0 - (long)local_f0);
    local_f0 = (void *)0x0;
    local_e8 = 0;
    local_e0 = 0;
    local_d8 = 0;
    local_d0 = 0;
  }
  std::
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  ::~vector(local_108);
  if (local_130[0] != local_120) {
    operator_delete(local_130[0],local_120[0] + 1);
  }
  std::
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  ::~vector(local_48);
  if (local_70 != (void *)0x0) {
    operator_delete(local_70,local_50 - (long)local_70);
    local_70 = (void *)0x0;
    local_68 = 0;
    local_60 = 0;
    local_58 = 0;
    local_50 = 0;
  }
  std::
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  ::~vector(local_88);
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0],local_a0[0] + 1);
  }
  return iVar4;
}

Assistant:

auto main(int argc, char * argv[]) -> int
{
    try {
        po::options_description display_options{"Program options"};
        display_options.add_options()            //
            ("help", "Display help information") //
            ("format", po::value<string>(), "Specify input file format (auto, lad, labelledlad, dimacs)");

        po::options_description all_options{"All options"};
        all_options.add_options()("graph-file", "Specify the graph file");

        all_options.add(display_options);

        po::positional_options_description positional_options;
        positional_options
            .add("graph-file", 1);

        po::variables_map options_vars;
        po::store(po::command_line_parser(argc, argv)
                      .options(all_options)
                      .positional(positional_options)
                      .run(),
            options_vars);
        po::notify(options_vars);

        /* --help? Show a message, and exit. */
        if (options_vars.count("help")) {
            cout << "Usage: " << argv[0] << " [options] graph-file" << endl;
            cout << endl;
            cout << display_options << endl;
            return EXIT_SUCCESS;
        }

        /* No input file specified? Show a message and exit. */
        if (! options_vars.count("graph-file")) {
            cout << "Usage: " << argv[0] << " [options] graph-file" << endl;
            return EXIT_FAILURE;
        }

        /* Read in the graphs */
        string pattern_format_name = options_vars.count("format") ? options_vars["format"].as<string>() : "auto";
        auto graph = read_file_format(pattern_format_name, options_vars["graph-file"].as<string>());

        if (graph.has_vertex_labels() || graph.has_edge_labels()) {
            cerr << "Error: unsupported graph features" << endl;
            return EXIT_FAILURE;
        }

        cout << graph.size() << endl;
        for (int i = 0; i < graph.size(); ++i) {
            cout << graph.degree(i);
            for (int j = 0; j < graph.size(); ++j)
                if (graph.adjacent(i, j))
                    cout << " " << j;
            cout << endl;
        }

        return EXIT_SUCCESS;
    }
    catch (const GraphFileError & e) {
        cerr << "Error: " << e.what() << endl;
        if (e.file_at_least_existed())
            cerr << "Maybe try specifying --format?" << endl;
        return EXIT_FAILURE;
    }
    catch (const po::error & e) {
        cerr << "Error: " << e.what() << endl;
        cerr << "Try " << argv[0] << " --help" << endl;
        return EXIT_FAILURE;
    }
    catch (const exception & e) {
        cerr << "Error: " << e.what() << endl;
        return EXIT_FAILURE;
    }
}